

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

Wln_Ntk_t * Wln_NtkDupDfs(Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  char *__s;
  int iVar3;
  int i;
  Wln_Ntk_t *pNew;
  size_t sVar4;
  char *__dest;
  int *piVar5;
  Wln_Vec_t *pWVar6;
  ulong uVar7;
  Wln_Vec_t *pWVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pNew = Wln_NtkAlloc(p->pName,(p->vTypes).nSize);
  pNew->fSmtLib = p->fSmtLib;
  __s = p->pSpec;
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
    pNew->pSpec = __dest;
  }
  uVar1 = (p->vTypes).nCap;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  if (0 < (p->vCis).nSize) {
    lVar11 = 0;
    do {
      Wln_ObjDup(pNew,p,(p->vCis).pArray[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCis).nSize);
  }
  uVar1 = (p->vFfs).nSize;
  uVar7 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar11 = 0;
    do {
      iVar2 = (p->vFfs).pArray[lVar11];
      iVar3 = Wln_ObjClone(pNew,p,iVar2);
      if (((long)iVar2 < 0) || ((p->vCopies).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar2] = iVar3;
      lVar11 = lVar11 + 1;
      uVar7 = (ulong)(p->vFfs).nSize;
    } while (lVar11 < (long)uVar7);
  }
  if (0 < (p->vCos).nSize) {
    lVar11 = 0;
    do {
      Wln_NtkDupDfs_rec(pNew,p,(p->vCos).pArray[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCos).nSize);
    uVar7 = (ulong)(uint)(p->vFfs).nSize;
  }
  if (0 < (int)uVar7) {
    pWVar6 = p->vFanins;
    lVar11 = 0;
    pWVar8 = pWVar6;
    do {
      iVar2 = (p->vFfs).pArray[lVar11];
      lVar9 = (long)iVar2;
      uVar10 = (ulong)(uint)pWVar8[lVar9].nSize;
      if (0 < pWVar8[lVar9].nSize) {
        lVar13 = lVar9 * 0x10 + 8;
        lVar12 = 0;
        do {
          if ((int)uVar10 < 3) {
            piVar5 = (int *)((long)&pWVar8->nCap + lVar13);
          }
          else {
            piVar5 = pWVar8[lVar9].field_2.pArray[0] + lVar12;
          }
          if (*piVar5 != 0) {
            if ((iVar2 < 0) || ((p->vCopies).nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = (p->vCopies).pArray[lVar9];
            i = Wln_NtkDupDfs_rec(pNew,p,*piVar5);
            Wln_ObjAddFanin(pNew,iVar3,i);
            pWVar6 = p->vFanins;
          }
          lVar12 = lVar12 + 1;
          uVar10 = (ulong)pWVar6[lVar9].nSize;
          lVar13 = lVar13 + 4;
          pWVar8 = pWVar6;
        } while (lVar12 < (long)uVar10);
        uVar7 = (ulong)(uint)(p->vFfs).nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar7);
  }
  if (0 < (p->vNameIds).nSize) {
    Wln_NtkTransferNames(pNew,p);
  }
  return pNew;
}

Assistant:

Wln_Ntk_t * Wln_NtkDupDfs( Wln_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Wln_Ntk_t * pNew = Wln_NtkAlloc( p->pName, Wln_NtkObjNum(p) );
    pNew->fSmtLib = p->fSmtLib;
    if ( p->pSpec ) pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Wln_NtkCleanCopy( p );
    Wln_NtkForEachCi( p, iObj, i )
        Wln_ObjDup( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjSetCopy( p, iObj, Wln_ObjClone(pNew, p, iObj) );
    Wln_NtkForEachCo( p, iObj, i )
        Wln_NtkDupDfs_rec( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjAddFanin( pNew, Wln_ObjCopy(p, iObj), Wln_NtkDupDfs_rec(pNew, p, iFanin) );
    if ( Wln_NtkHasNameId(p) )
        Wln_NtkTransferNames( pNew, p );
    return pNew;
}